

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O0

void google::protobuf::compiler::objectivec::anon_unknown_0::
     CollectMinimalFileDepsContainingExtensionsWorker
               (FileDescriptor *file,
               vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *files,set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      *files_visited)

{
  bool bVar1;
  int iVar2;
  FileDescriptor *pFVar3;
  FileDescriptor *dep_1;
  int i_1;
  FileDescriptor *dep;
  int i;
  _Self local_30;
  _Self local_28;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_20;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *files_visited_local;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *files_local;
  FileDescriptor *file_local;
  
  local_20 = files_visited;
  files_visited_local =
       (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        *)files;
  files_local = (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 *)file;
  local_28._M_node =
       (_Base_ptr)
       std::
       set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
       ::find(files_visited,(key_type *)&files_local);
  local_30._M_node =
       (_Base_ptr)
       std::
       set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
       ::end(local_20);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (!bVar1) {
    std::
    set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::insert(local_20,(value_type *)&files_local);
    bVar1 = FileContainsExtensions((FileDescriptor *)files_local);
    if (bVar1) {
      std::
      vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::push_back((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   *)files_visited_local,(value_type *)&files_local);
      for (dep._4_4_ = 0; iVar2 = FileDescriptor::dependency_count((FileDescriptor *)files_local),
          dep._4_4_ < iVar2; dep._4_4_ = dep._4_4_ + 1) {
        pFVar3 = FileDescriptor::dependency((FileDescriptor *)files_local,dep._4_4_);
        PruneFileAndDepsMarkingAsVisited
                  (pFVar3,(vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                           *)files_visited_local,local_20);
      }
    }
    else {
      for (dep_1._4_4_ = 0; iVar2 = FileDescriptor::dependency_count((FileDescriptor *)files_local),
          dep_1._4_4_ < iVar2; dep_1._4_4_ = dep_1._4_4_ + 1) {
        pFVar3 = FileDescriptor::dependency((FileDescriptor *)files_local,dep_1._4_4_);
        CollectMinimalFileDepsContainingExtensionsWorker
                  (pFVar3,(vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                           *)files_visited_local,local_20);
      }
    }
  }
  return;
}

Assistant:

void CollectMinimalFileDepsContainingExtensionsWorker(
    const FileDescriptor* file,
    std::vector<const FileDescriptor*>* files,
    std::set<const FileDescriptor*>* files_visited) {
  if (files_visited->find(file) != files_visited->end()) {
    return;
  }
  files_visited->insert(file);

  if (FileContainsExtensions(file)) {
    files->push_back(file);
    for (int i = 0; i < file->dependency_count(); i++) {
      const FileDescriptor* dep = file->dependency(i);
      PruneFileAndDepsMarkingAsVisited(dep, files, files_visited);
    }
  } else {
    for (int i = 0; i < file->dependency_count(); i++) {
      const FileDescriptor* dep = file->dependency(i);
      CollectMinimalFileDepsContainingExtensionsWorker(dep, files,
                                                       files_visited);
    }
  }
}